

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_queue.cpp
# Opt level: O2

span<const_unsigned_char> __thiscall mpt::io::queue::peek(queue *this,size_t len)

{
  size_t sVar1;
  uchar *puVar2;
  uchar *puVar3;
  size_t sVar4;
  span<const_unsigned_char> sVar5;
  size_t low;
  ulong local_28;
  
  local_28 = 0;
  puVar2 = (uchar *)mpt_queue_data(&this->_d,&local_28);
  sVar1 = (this->_d).len;
  if (len == 0) {
    len = sVar1;
  }
  sVar4 = local_28;
  if ((local_28 < len) && (sVar4 = sVar1, (this->_d).max - sVar1 < (this->_d).off)) {
    mpt_queue_align(&this->_d,0);
    puVar2 = (uchar *)(this->_d).base;
    sVar4 = (this->_d).len;
  }
  puVar3 = (uchar *)0x0;
  if (-1 < (long)sVar4) {
    puVar3 = puVar2;
  }
  sVar5._len = sVar4;
  sVar5._base = puVar3;
  return sVar5;
}

Assistant:

span<const uint8_t> io::queue::peek(size_t len)
{
	size_t low = 0;
	void *base = mpt_queue_data(&_d, &low);
	
	if (!len) len = _d.len;
	
	if (len <= low) {
		len = low;
	}
	else if (!_d.fragmented()) {
		len = _d.len;
	}
	else {
		mpt_queue_align(&_d, 0);
		base = _d.base;
		len = _d.len;
	}
	return span<const uint8_t>(static_cast<uint8_t *>(base), len);
}